

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O1

value hello_world_class_impl_interface_static_invoke
                (klass cls,class_impl impl,method m,void **args,size_t argc)

{
  return (value)0x0;
}

Assistant:

value hello_world_class_impl_interface_static_invoke(klass cls, class_impl impl, method m, class_args args, size_t argc)
{
	// TODO
	(void)cls;
	(void)impl;
	(void)m;
	(void)args;
	(void)argc;

	return NULL;
}